

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O0

void __thiscall
JSON::JSONScanner::BuildUnescapedString(JSONScanner *this,bool shouldSkipLastCharacter)

{
  undefined4 uVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar8;
  char16_t *pcVar9;
  Type *pTVar10;
  int charactersToCopy;
  RangeCharacterPair data;
  int i;
  int lastCharacterIndex;
  char16 *begin_copy;
  int totalCopied;
  TrackAllocData local_40;
  uint local_18;
  byte local_11;
  int requiredSize;
  bool shouldSkipLastCharacter_local;
  JSONScanner *this_local;
  
  local_11 = shouldSkipLastCharacter;
  _requiredSize = this;
  if (this->allocator == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x199,"(this->allocator != nullptr)","We must have built the allocator");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->currentRangeCharacterPairList == (RangeCharacterPairList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19a,"(this->currentRangeCharacterPairList != nullptr)",
                       "We must have built the currentRangeCharacterPairList");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar5 = JsUtil::
          ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count(&this->currentRangeCharacterPairList->
                   super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 );
  if (iVar5 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19b,"(this->currentRangeCharacterPairList->Count() > 0)",
                       "We need to build the current string only because we have escaped characters"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  local_18 = GetCurrentStringLen(this);
  if (this->stringBufferLength < (int)local_18) {
    if (this->stringBuffer != (char16 *)0x0) {
      Memory::DeleteArray<Memory::ArenaAllocator,char16_t>
                (this->allocator,(long)this->stringBufferLength,this->stringBuffer);
      this->stringBuffer = (char16 *)0x0;
    }
    pAVar8 = &this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&char16_t::typeinfo,0,(long)(int)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
               ,0x1a7);
    pAVar8 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar8,&local_40);
    pcVar9 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                       ((Memory *)pAVar8,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (long)(int)local_18);
    this->stringBuffer = pcVar9;
    this->stringBufferLength = local_18;
  }
  begin_copy._4_4_ = 0;
  _i = this->stringBuffer;
  iVar5 = JsUtil::
          ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count(&this->currentRangeCharacterPairList->
                   super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 );
  for (data.m_rangeLength = 0; (int)data.m_rangeLength <= (int)(iVar5 - 1U);
      data.m_rangeLength = data.m_rangeLength + 1) {
    pTVar10 = JsUtil::
              List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this->currentRangeCharacterPairList,data.m_rangeLength);
    uVar2._0_4_ = pTVar10->m_rangeStart;
    uVar2._4_4_ = pTVar10->m_rangeLength;
    uVar1 = *(undefined4 *)&pTVar10->m_char;
    js_wmemcpy_s(_i,(long)(int)uVar2._4_4_,this->inputText + (uVar2 & 0xffffffff),
                 (long)(int)uVar2._4_4_);
    _i = _i + (int)uVar2._4_4_;
    begin_copy._4_4_ = uVar2._4_4_ + begin_copy._4_4_;
    if ((data.m_rangeLength != iVar5 - 1U) || ((local_11 & 1) == 0)) {
      data.m_rangeStart._0_2_ = (char16)uVar1;
      *_i = (char16)data.m_rangeStart;
      _i = _i + 1;
      begin_copy._4_4_ = begin_copy._4_4_ + 1;
    }
  }
  if ((begin_copy._4_4_ != local_18) &&
     (Output::TraceWithFlush
                (JSONPhase,L"BuildUnescapedString(): allocated size = %d != copying size %d\n",
                 (ulong)local_18,(ulong)begin_copy._4_4_), begin_copy._4_4_ != local_18)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x1c4,"(totalCopied == requiredSize)",
                       "BuildUnescapedString(): The allocated size and copying size should match.");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar6 = GetCurrentStringLen(this);
  Output::TraceWithFlush
            (JSONPhase,L"BuildUnescapedString(): unescaped string as \'%.*s\'\n",(ulong)uVar6,
             this->stringBuffer);
  return;
}

Assistant:

void JSONScanner::BuildUnescapedString(bool shouldSkipLastCharacter)
    {
        AssertMsg(this->allocator != nullptr, "We must have built the allocator");
        AssertMsg(this->currentRangeCharacterPairList != nullptr, "We must have built the currentRangeCharacterPairList");
        AssertMsg(this->currentRangeCharacterPairList->Count() > 0, "We need to build the current string only because we have escaped characters");

        // Step 1: Ensure the buffer has sufficient space
        int requiredSize = this->GetCurrentStringLen();
        if (requiredSize > this->stringBufferLength)
        {
            if (this->stringBuffer)
            {
                AdeleteArray(this->allocator, this->stringBufferLength, this->stringBuffer);
                this->stringBuffer = nullptr;
            }

            this->stringBuffer = AnewArray(this->allocator, char16, requiredSize);
            this->stringBufferLength = requiredSize;
        }

        // Step 2: Copy the data to the buffer
        int totalCopied = 0;
        char16* begin_copy = this->stringBuffer;
        int lastCharacterIndex = this->currentRangeCharacterPairList->Count() - 1;
        for (int i = 0; i <= lastCharacterIndex; i++)
        {
            RangeCharacterPair data = this->currentRangeCharacterPairList->Item(i);
            int charactersToCopy = data.m_rangeLength;
            js_wmemcpy_s(begin_copy, charactersToCopy, this->inputText + data.m_rangeStart, charactersToCopy);
            begin_copy += charactersToCopy;
            totalCopied += charactersToCopy;

            if (i == lastCharacterIndex && shouldSkipLastCharacter)
            {
                continue;
            }

            *begin_copy = data.m_char;
            begin_copy++;
            totalCopied++;
        }

        if (totalCopied != requiredSize)
        {
            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): allocated size = %d != copying size %d\n"), requiredSize, totalCopied);
            AssertMsg(totalCopied == requiredSize, "BuildUnescapedString(): The allocated size and copying size should match.");
        }

        OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): unescaped string as '%.*s'\n"), GetCurrentStringLen(), this->stringBuffer);
    }